

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cxx17_string_view.cpp
# Opt level: O1

void __thiscall
iu_StringViewSplit_x_iutest_x_chain_back_by_c_str_Test<wchar_t>::Body
          (iu_StringViewSplit_x_iutest_x_chain_back_by_c_str_Test<wchar_t> *this)

{
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *in_R9;
  AssertionResult iutest_ar;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> s;
  split_helper_subroutine<detail::get_back,_const_wchar_t_*,_wchar_t> local_208;
  AssertionResult local_200;
  AssertionHelper local_1d8;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_1a8;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_198 [8];
  ios_base local_118 [264];
  
  local_1a8._M_len = 0x13;
  local_1a8._M_str = L"arikitari na_world!";
  local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = "world!";
  local_208.delim = L"_ ";
  local_198[0] = ::detail::
                 operator|<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_const_wchar_t_*,_wchar_t,_nullptr>
                           (&local_1a8,&local_208);
  iutest::internal::
  CmpHelperEQ<wchar_t_const*,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
            (&local_200,(internal *)"constant::world<char_type>()","s | split(delim) >> back()",
             (char *)&local_1d8,(wchar_t **)local_198,in_R9);
  if (local_200.m_result == false) {
    memset(local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,local_200.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_208);
    local_1d8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_cxx17_string_view.cpp"
    ;
    local_1d8.m_part_result.super_iuCodeMessage.m_line = 0x39;
    local_1d8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1d8,(Fixed *)local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1d8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1d8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base(local_118);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.m_message._M_dataplus._M_p != &local_200.m_message.field_2) {
    operator_delete(local_200.m_message._M_dataplus._M_p,
                    local_200.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST_TYPED_TEST(StringViewSplit, chain_back_by_c_str)
{
	using char_type = TypeParam;
	const std::basic_string_view<char_type> s = constant::arikitari_na_world_underscore<char_type>();
	constexpr auto delim = constant::space_underscore<char_type>();
	IUTEST_ASSERT_EQ(constant::world<char_type>(), s | split(delim) >> back());
}